

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddComputeRangeCube(DdManager *dd,int iStart,int iStop)

{
  DdNode *n;
  int local_2c;
  DdNode *pDStack_28;
  int i;
  DdNode *bProd;
  DdNode *bTemp;
  int iStop_local;
  int iStart_local;
  DdManager *dd_local;
  
  if (iStop < iStart) {
    __assert_fail("iStart <= iStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                  ,0x2bf,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
  }
  if ((-1 < iStart) && (iStart <= dd->size)) {
    if ((-1 < iStop) && (iStop <= dd->size)) {
      pDStack_28 = dd->one;
      Cudd_Ref(pDStack_28);
      for (local_2c = iStart; local_2c < iStop; local_2c = local_2c + 1) {
        n = Cudd_bddAnd(dd,pDStack_28,dd->vars[local_2c]);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDStack_28);
        pDStack_28 = n;
      }
      Cudd_Deref(pDStack_28);
      return pDStack_28;
    }
    __assert_fail("iStop >= 0 && iStop <= dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                  ,0x2c1,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
  }
  __assert_fail("iStart >= 0 && iStart <= dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                ,0x2c0,"DdNode *Extra_bddComputeRangeCube(DdManager *, int, int)");
}

Assistant:

DdNode * Extra_bddComputeRangeCube( DdManager * dd, int iStart, int iStop )
{
    DdNode * bTemp, * bProd;
    int i;
    assert( iStart <= iStop );
    assert( iStart >= 0 && iStart <= dd->size );
    assert( iStop >= 0  && iStop  <= dd->size );
    bProd = b1;         Cudd_Ref( bProd );
    for ( i = iStart; i < iStop; i++ )
    {
        bProd = Cudd_bddAnd( dd, bTemp = bProd, dd->vars[i] );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_Deref( bProd );
    return bProd;
}